

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O2

void __thiscall DHUDMessage::Serialize(DHUDMessage *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = FSerializer::operator()(arc,"left",&this->Left);
  pFVar1 = FSerializer::operator()(pFVar1,"top",&this->Top);
  pFVar1 = FSerializer::operator()(pFVar1,"centerx",&this->CenterX);
  pFVar1 = FSerializer::operator()(pFVar1,"holdtics",&this->HoldTics);
  pFVar1 = FSerializer::operator()(pFVar1,"tics",&this->Tics);
  pFVar1 = FSerializer::operator()(pFVar1,"state",&this->State);
  pFVar1 = FSerializer::Enum<EColorRange>(pFVar1,"textcolor",&this->TextColor);
  pFVar1 = FSerializer::operator()(pFVar1,"sbarid",&this->SBarID);
  pFVar1 = FSerializer::operator()(pFVar1,"sourcetext",&this->SourceText);
  pFVar1 = FSerializer::operator()(pFVar1,"font",&this->Font);
  pFVar1 = FSerializer::operator()(pFVar1,"next",&this->Next);
  pFVar1 = FSerializer::operator()(pFVar1,"hudwidth",&this->HUDWidth);
  pFVar1 = FSerializer::operator()(pFVar1,"hudheight",&this->HUDHeight);
  pFVar1 = FSerializer::operator()(pFVar1,"nowrap",&this->NoWrap);
  pFVar1 = FSerializer::operator()(pFVar1,"clipx",&this->ClipX);
  pFVar1 = FSerializer::operator()(pFVar1,"clipy",&this->ClipY);
  pFVar1 = FSerializer::operator()(pFVar1,"clipwidth",&this->ClipWidth);
  pFVar1 = FSerializer::operator()(pFVar1,"clipheight",&this->ClipHeight);
  pFVar1 = FSerializer::operator()(pFVar1,"wrapwidth",&this->WrapWidth);
  pFVar1 = FSerializer::operator()(pFVar1,"handleaspect",&this->HandleAspect);
  pFVar1 = FSerializer::operator()(pFVar1,"visibilityflags",&this->VisibilityFlags);
  pFVar1 = FSerializer::operator()(pFVar1,"style",&this->Style);
  FSerializer::operator()(pFVar1,"alpha",&this->Alpha);
  if (arc->r != (FReader *)0x0) {
    this->Lines = (FBrokenLines *)0x0;
    (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
    return;
  }
  return;
}

Assistant:

void DHUDMessage::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("left", Left)
		("top", Top)
		("centerx", CenterX)
		("holdtics", HoldTics)
		("tics", Tics)
		("state", State)
		.Enum("textcolor", TextColor)
		("sbarid", SBarID)
		("sourcetext", SourceText)
		("font", Font)
		("next", Next)
		("hudwidth", HUDWidth)
		("hudheight", HUDHeight)
		("nowrap", NoWrap)
		("clipx", ClipX)
		("clipy", ClipY)
		("clipwidth", ClipWidth)
		("clipheight", ClipHeight)
		("wrapwidth", WrapWidth)
		("handleaspect", HandleAspect)
		("visibilityflags", VisibilityFlags)
		("style", Style)
		("alpha", Alpha);

	if (arc.isReading())
	{
		Lines = NULL;
		ResetText(SourceText);
	}
}